

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator_expression.hpp
# Opt level: O3

string * __thiscall
duckdb::OperatorExpression::ToString<duckdb::BoundOperatorExpression,duckdb::Expression>
          (string *__return_storage_ptr__,OperatorExpression *this,BoundOperatorExpression *entry)

{
  ExpressionType EVar1;
  long lVar2;
  pointer pcVar3;
  int iVar4;
  const_reference pvVar5;
  pointer pEVar6;
  long *plVar7;
  undefined8 *puVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  InternalException *this_00;
  size_type *psVar10;
  ulong *puVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  ExpressionType type;
  ExpressionType type_00;
  char *pcVar13;
  _Alloc_hider _Var14;
  undefined8 uVar15;
  SQLIdentifier *in_R8;
  ulong __n;
  ExpressionType *pEVar16;
  string op_type;
  string in_child;
  string child_list;
  string op;
  string local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  string *local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_150 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_130 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  char local_90 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  string local_70;
  string local_50;
  
  ExpressionTypeToOperator_abi_cxx11_
            (&local_f0,(duckdb *)(ulong)(this->super_ParsedExpression).super_BaseExpression.type,
             (ExpressionType)entry);
  if (local_f0._M_string_length != 0) {
    pEVar16 = &this[1].super_ParsedExpression.super_BaseExpression.type;
    pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                           *)pEVar16,0);
    pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar5);
    (*(pEVar6->super_BaseExpression)._vptr_BaseExpression[8])(&local_238,pEVar6);
    plVar7 = (long *)::std::__cxx11::string::append((char *)&local_238);
    psVar10 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_218.field_2._M_allocated_capacity = *psVar10;
      local_218.field_2._8_8_ = plVar7[3];
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    }
    else {
      local_218.field_2._M_allocated_capacity = *psVar10;
      local_218._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_218._M_string_length = plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)::std::__cxx11::string::_M_append
                               ((char *)&local_218,(ulong)local_f0._M_dataplus._M_p);
    puVar11 = (ulong *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar11) {
      local_258.field_2._M_allocated_capacity = *puVar11;
      local_258.field_2._8_8_ = plVar7[3];
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    }
    else {
      local_258.field_2._M_allocated_capacity = *puVar11;
      local_258._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_258._M_string_length = plVar7[1];
    *plVar7 = (long)puVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    puVar8 = (undefined8 *)::std::__cxx11::string::append((char *)&local_258);
    paVar9 = &local_278.field_2;
    puVar11 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar11) {
      local_278.field_2._M_allocated_capacity = *puVar11;
      local_278.field_2._8_8_ = puVar8[3];
      local_278._M_dataplus._M_p = (pointer)paVar9;
    }
    else {
      local_278.field_2._M_allocated_capacity = *puVar11;
      local_278._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_278._M_string_length = puVar8[1];
    *puVar8 = puVar11;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                           *)pEVar16,1);
    pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar5);
    (*(pEVar6->super_BaseExpression)._vptr_BaseExpression[8])(&local_1f8,pEVar6);
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != paVar9) {
      uVar15 = local_278.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < local_1f8._M_string_length + local_278._M_string_length) {
      uVar15 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        uVar15 = local_1f8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar15 < local_1f8._M_string_length + local_278._M_string_length)
      goto LAB_006b8cd6;
      puVar8 = (undefined8 *)
               ::std::__cxx11::string::replace
                         ((ulong)&local_1f8,0,(char *)0x0,(ulong)local_278._M_dataplus._M_p);
    }
    else {
LAB_006b8cd6:
      puVar8 = (undefined8 *)
               ::std::__cxx11::string::_M_append
                         ((char *)&local_278,(ulong)local_1f8._M_dataplus._M_p);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar10 = puVar8 + 2;
    if ((size_type *)*puVar8 == psVar10) {
      uVar15 = puVar8[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar15;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar8;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
    }
    __return_storage_ptr__->_M_string_length = puVar8[1];
    *puVar8 = psVar10;
    puVar8[1] = 0;
    *(undefined1 *)psVar10 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != paVar9) {
      operator_delete(local_278._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    paVar9 = &local_238.field_2;
    goto LAB_006b8e00;
  }
  EVar1 = (this->super_ParsedExpression).super_BaseExpression.type;
  if (OPERATOR_NULLIF < EVar1) {
    switch(EVar1) {
    case OPERATOR_COALESCE:
switchD_006b8d00_caseD_98:
      ExpressionTypeToString_abi_cxx11_(__return_storage_ptr__,(duckdb *)(ulong)EVar1,type);
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      lVar2 = *(long *)&this[1].super_ParsedExpression.super_BaseExpression.type;
      pcVar3 = this[1].super_ParsedExpression.super_BaseExpression.alias._M_dataplus._M_p;
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,", ","");
      StringUtil::
      Join<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,unsigned_long,duckdb::OperatorExpression::ToString<duckdb::BoundOperatorExpression,duckdb::Expression>(duckdb::BoundOperatorExpression_const&)::_lambda(duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>const&)_2_>
                (&local_278,(StringUtil *)&this[1].super_ParsedExpression.super_BaseExpression.type,
                 (long)pcVar3 - lVar2 >> 3,&local_258);
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_278._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p);
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      goto LAB_006b8e0e;
    case ARRAY_EXTRACT:
      pEVar16 = &this[1].super_ParsedExpression.super_BaseExpression.type;
      pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                             *)pEVar16,0);
      pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar5);
      (*(pEVar6->super_BaseExpression)._vptr_BaseExpression[8])(&local_218,pEVar6);
      puVar8 = (undefined8 *)::std::__cxx11::string::append((char *)&local_218);
      paVar9 = &local_258.field_2;
      puVar11 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar11) {
        local_258.field_2._M_allocated_capacity = *puVar11;
        local_258.field_2._8_8_ = puVar8[3];
        local_258._M_dataplus._M_p = (pointer)paVar9;
      }
      else {
        local_258.field_2._M_allocated_capacity = *puVar11;
        local_258._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_258._M_string_length = puVar8[1];
      *puVar8 = puVar11;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                             *)pEVar16,1);
      pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar5);
      (*(pEVar6->super_BaseExpression)._vptr_BaseExpression[8])(&local_238,pEVar6);
      uVar15 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != paVar9) {
        uVar15 = local_258.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar15 < local_238._M_string_length + local_258._M_string_length) {
        uVar15 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          uVar15 = local_238.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar15 < local_238._M_string_length + local_258._M_string_length)
        goto LAB_006b97cb;
        puVar8 = (undefined8 *)
                 ::std::__cxx11::string::replace
                           ((ulong)&local_238,0,(char *)0x0,(ulong)local_258._M_dataplus._M_p);
      }
      else {
LAB_006b97cb:
        puVar8 = (undefined8 *)
                 ::std::__cxx11::string::_M_append
                           ((char *)&local_258,(ulong)local_238._M_dataplus._M_p);
      }
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      puVar11 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar11) {
        local_278.field_2._M_allocated_capacity = *puVar11;
        local_278.field_2._8_8_ = puVar8[3];
      }
      else {
        local_278.field_2._M_allocated_capacity = *puVar11;
        local_278._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_278._M_string_length = puVar8[1];
      *puVar8 = puVar11;
      puVar8[1] = 0;
      *(undefined1 *)puVar11 = 0;
      plVar7 = (long *)::std::__cxx11::string::append((char *)&local_278);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar10 = (size_type *)(plVar7 + 2);
      if ((size_type *)*plVar7 == psVar10) {
        lVar2 = plVar7[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar7;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
      }
      __return_storage_ptr__->_M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != paVar9) {
        operator_delete(local_258._M_dataplus._M_p);
      }
      paVar9 = &local_218.field_2;
      goto LAB_006b8e00;
    case ARRAY_SLICE:
      pEVar16 = &this[1].super_ParsedExpression.super_BaseExpression.type;
      pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                             *)pEVar16,1);
      pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar5);
      (*(pEVar6->super_BaseExpression)._vptr_BaseExpression[8])(&local_278,pEVar6);
      iVar4 = ::std::__cxx11::string::compare((char *)&local_278);
      if (iVar4 == 0) {
        ::std::__cxx11::string::operator=((string *)&local_278,anon_var_dwarf_63f17de + 9);
      }
      pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                             *)pEVar16,2);
      pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar5);
      (*(pEVar6->super_BaseExpression)._vptr_BaseExpression[8])(&local_258,pEVar6);
      iVar4 = ::std::__cxx11::string::compare((char *)&local_258);
      if (iVar4 == 0) {
        pcVar13 = anon_var_dwarf_63f17de + 9;
        if ((long)this[1].super_ParsedExpression.super_BaseExpression.alias._M_dataplus._M_p -
            *(long *)&this[1].super_ParsedExpression.super_BaseExpression.type == 0x20) {
          pcVar13 = "-";
        }
        ::std::__cxx11::string::operator=((string *)&local_258,pcVar13);
      }
      if ((long)this[1].super_ParsedExpression.super_BaseExpression.alias._M_dataplus._M_p -
          *(long *)&this[1].super_ParsedExpression.super_BaseExpression.type == 0x20) {
        pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                               *)pEVar16,0);
        pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar5);
        (*(pEVar6->super_BaseExpression)._vptr_BaseExpression[8])(local_90,pEVar6);
        plVar7 = (long *)::std::__cxx11::string::append(local_90);
        psVar10 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_190.field_2._M_allocated_capacity = *psVar10;
          local_190.field_2._8_8_ = plVar7[3];
          local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
        }
        else {
          local_190.field_2._M_allocated_capacity = *psVar10;
          local_190._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_190._M_string_length = plVar7[1];
        *plVar7 = (long)psVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        ::std::operator+(&local_1b0,&local_190,&local_278);
        puVar8 = (undefined8 *)::std::__cxx11::string::append((char *)&local_1b0);
        psVar10 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_1d0.field_2._M_allocated_capacity = *psVar10;
          local_1d0.field_2._8_8_ = puVar8[3];
          local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
        }
        else {
          local_1d0.field_2._M_allocated_capacity = *psVar10;
          local_1d0._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_1d0._M_string_length = puVar8[1];
        *puVar8 = psVar10;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        ::std::operator+(&local_1f8,&local_1d0,&local_258);
        puVar8 = (undefined8 *)::std::__cxx11::string::append((char *)&local_1f8);
        puVar11 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar11) {
          local_238.field_2._M_allocated_capacity = *puVar11;
          local_238.field_2._8_8_ = puVar8[3];
          local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
        }
        else {
          local_238.field_2._M_allocated_capacity = *puVar11;
          local_238._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_238._M_string_length = puVar8[1];
        *puVar8 = puVar11;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                               *)pEVar16,3);
        pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar5);
        (*(pEVar6->super_BaseExpression)._vptr_BaseExpression[8])(&local_b0,pEVar6);
        ::std::operator+(&local_218,&local_238,&local_b0);
        ::std::operator+(__return_storage_ptr__,&local_218,"]");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
          operator_delete(local_1b0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p);
        }
        paVar9 = &local_80;
      }
      else {
        pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                               *)pEVar16,0);
        pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar5);
        (*(pEVar6->super_BaseExpression)._vptr_BaseExpression[8])(&local_1b0,pEVar6);
        plVar7 = (long *)::std::__cxx11::string::append((char *)&local_1b0);
        psVar10 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_1d0.field_2._M_allocated_capacity = *psVar10;
          local_1d0.field_2._8_8_ = plVar7[3];
          local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
        }
        else {
          local_1d0.field_2._M_allocated_capacity = *psVar10;
          local_1d0._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_1d0._M_string_length = plVar7[1];
        *plVar7 = (long)psVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        ::std::operator+(&local_1f8,&local_1d0,&local_278);
        puVar8 = (undefined8 *)::std::__cxx11::string::append((char *)&local_1f8);
        puVar11 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar11) {
          local_238.field_2._M_allocated_capacity = *puVar11;
          local_238.field_2._8_8_ = puVar8[3];
          local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
        }
        else {
          local_238.field_2._M_allocated_capacity = *puVar11;
          local_238._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_238._M_string_length = puVar8[1];
        *puVar8 = puVar11;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        ::std::operator+(&local_218,&local_238,&local_258);
        ::std::operator+(__return_storage_ptr__,&local_218,"]");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p);
        }
        paVar9 = &local_1b0.field_2;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*(undefined1 **)(paVar9->_M_local_buf + -0x10) != paVar9) {
        operator_delete(*(undefined1 **)(paVar9->_M_local_buf + -0x10));
      }
      _Var14._M_p = local_258._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
LAB_006b9c9a:
        operator_delete(_Var14._M_p);
      }
      break;
    case STRUCT_EXTRACT:
      pEVar16 = &this[1].super_ParsedExpression.super_BaseExpression.type;
      pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                             *)pEVar16,1);
      pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar5);
      if ((pEVar6->super_BaseExpression).type != VALUE_CONSTANT) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        __return_storage_ptr__->_M_string_length = 0;
        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
        goto LAB_006b8e0e;
      }
      pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                             *)pEVar16,1);
      pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar5);
      (*(pEVar6->super_BaseExpression)._vptr_BaseExpression[8])(&local_278,pEVar6);
      local_150[0] = &local_140;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"(%s).%s","");
      pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                             *)pEVar16,0);
      pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar5);
      (*(pEVar6->super_BaseExpression)._vptr_BaseExpression[8])(&local_d0,pEVar6);
      ::std::__cxx11::string::substr((ulong)&local_258,(ulong)&local_278);
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_170,local_258._M_dataplus._M_p,
                 local_258._M_dataplus._M_p + local_258._M_string_length);
      StringUtil::Format<std::__cxx11::string,duckdb::SQLIdentifier>
                (__return_storage_ptr__,(StringUtil *)local_150,&local_d0,&local_170,in_R8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      _Var14._M_p = (pointer)local_150[0];
      if (local_150[0] != &local_140) goto LAB_006b9c9a;
      break;
    case ARRAY_CONSTRUCTOR:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,"(ARRAY[","");
      lVar2 = *(long *)&this[1].super_ParsedExpression.super_BaseExpression.type;
      pcVar3 = this[1].super_ParsedExpression.super_BaseExpression.alias._M_dataplus._M_p;
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,", ","");
      StringUtil::
      Join<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,unsigned_long,duckdb::OperatorExpression::ToString<duckdb::BoundOperatorExpression,duckdb::Expression>(duckdb::BoundOperatorExpression_const&)::_lambda(duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>const&)_3_>
                (&local_278,(StringUtil *)&this[1].super_ParsedExpression.super_BaseExpression.type,
                 (long)pcVar3 - lVar2 >> 3,&local_258);
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_278._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p);
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      goto LAB_006b8e0e;
    default:
switchD_006b8d00_caseD_9d:
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_278,"Unrecognized operator type","");
      InternalException::InternalException(this_00,&local_278);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    case OPERATOR_TRY:
      paVar9 = &local_120;
      local_130[0] = paVar9;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"TRY(%s)","");
      pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                             *)&this[1].super_ParsedExpression.super_BaseExpression.type,0);
      pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar5);
      pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (pEVar6->super_BaseExpression)._vptr_BaseExpression;
      (*(code *)pbVar12[2]._M_dataplus._M_p)(&local_70,pEVar6);
      StringUtil::Format<std::__cxx11::string>
                (__return_storage_ptr__,(StringUtil *)local_130,&local_70,pbVar12);
      _Var14._M_p = (pointer)local_130[0];
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
        _Var14._M_p = (pointer)local_130[0];
      }
      goto LAB_006b96ac;
    }
    paVar9 = &local_278.field_2;
    goto LAB_006b8e00;
  }
  switch(EVar1) {
  case OPERATOR_NOT:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"(","");
    local_1d8 = (string *)&__return_storage_ptr__->field_2;
    ExpressionTypeToString_abi_cxx11_
              (&local_278,(duckdb *)(ulong)(this->super_ParsedExpression).super_BaseExpression.type,
               type_00);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_278._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    lVar2 = *(long *)&this[1].super_ParsedExpression.super_BaseExpression.type;
    pcVar3 = this[1].super_ParsedExpression.super_BaseExpression.alias._M_dataplus._M_p;
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,", ","");
    StringUtil::
    Join<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,unsigned_long,duckdb::OperatorExpression::ToString<duckdb::BoundOperatorExpression,duckdb::Expression>(duckdb::BoundOperatorExpression_const&)::_lambda(duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>const&)_1_>
              (&local_278,(StringUtil *)&this[1].super_ParsedExpression.super_BaseExpression.type,
               (long)pcVar3 - lVar2 >> 3,&local_258);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_278._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    goto LAB_006b8e0e;
  case OPERATOR_IS_NULL:
    pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                           *)&this[1].super_ParsedExpression.super_BaseExpression.type,0);
    pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar5);
    (*(pEVar6->super_BaseExpression)._vptr_BaseExpression[8])(&local_258);
    puVar8 = (undefined8 *)
             ::std::__cxx11::string::replace((ulong)&local_258,0,(char *)0x0,0x13891ac);
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    puVar11 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar11) {
      local_278.field_2._M_allocated_capacity = *puVar11;
      local_278.field_2._8_8_ = puVar8[3];
    }
    else {
      local_278.field_2._M_allocated_capacity = *puVar11;
      local_278._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_278._M_string_length = puVar8[1];
    *puVar8 = puVar11;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    plVar7 = (long *)::std::__cxx11::string::append((char *)&local_278);
    break;
  case OPERATOR_IS_NOT_NULL:
    pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                           *)&this[1].super_ParsedExpression.super_BaseExpression.type,0);
    pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar5);
    (*(pEVar6->super_BaseExpression)._vptr_BaseExpression[8])(&local_258);
    puVar8 = (undefined8 *)
             ::std::__cxx11::string::replace((ulong)&local_258,0,(char *)0x0,0x13891ac);
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    puVar11 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar11) {
      local_278.field_2._M_allocated_capacity = *puVar11;
      local_278.field_2._8_8_ = puVar8[3];
    }
    else {
      local_278.field_2._M_allocated_capacity = *puVar11;
      local_278._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_278._M_string_length = puVar8[1];
    *puVar8 = puVar11;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    plVar7 = (long *)::std::__cxx11::string::append((char *)&local_278);
    break;
  case OPERATOR_UNPACK:
    paVar9 = &local_100;
    local_110[0] = paVar9;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"UNPACK(%s)","");
    pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                           *)&this[1].super_ParsedExpression.super_BaseExpression.type,0);
    pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar5);
    pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (pEVar6->super_BaseExpression)._vptr_BaseExpression;
    (*(code *)pbVar12[2]._M_dataplus._M_p)(&local_50,pEVar6);
    StringUtil::Format<std::__cxx11::string>
              (__return_storage_ptr__,(StringUtil *)local_110,&local_50,pbVar12);
    _Var14._M_p = (pointer)local_110[0];
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
      _Var14._M_p = (pointer)local_110[0];
    }
    goto LAB_006b96ac;
  default:
    if (1 < EVar1 - 0x23) {
      if (EVar1 != GROUPING_FUNCTION) goto switchD_006b8d00_caseD_9d;
      goto switchD_006b8d00_caseD_98;
    }
    pcVar13 = " NOT IN ";
    if (EVar1 == COMPARE_IN) {
      pcVar13 = " IN ";
    }
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_278,pcVar13,pcVar13 + (ulong)(EVar1 != COMPARE_IN) * 4 + 4);
    pEVar16 = &this[1].super_ParsedExpression.super_BaseExpression.type;
    pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                           *)pEVar16,0);
    pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar5);
    (*(pEVar6->super_BaseExpression)._vptr_BaseExpression[8])(&local_258,pEVar6);
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    local_1d8 = __return_storage_ptr__;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"(","");
    if (8 < (ulong)((long)this[1].super_ParsedExpression.super_BaseExpression.alias._M_dataplus._M_p
                   - *(long *)&this[1].super_ParsedExpression.super_BaseExpression.type)) {
      __n = 1;
      do {
        if (1 < __n) {
          ::std::__cxx11::string::append((char *)&local_218);
        }
        pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                               *)pEVar16,__n);
        pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar5);
        (*(pEVar6->super_BaseExpression)._vptr_BaseExpression[8])(&local_238,pEVar6);
        ::std::__cxx11::string::_M_append((char *)&local_218,(ulong)local_238._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p);
        }
        __n = __n + 1;
      } while (__n < (ulong)((long)this[1].super_ParsedExpression.super_BaseExpression.alias.
                                   _M_dataplus._M_p -
                             *(long *)&this[1].super_ParsedExpression.super_BaseExpression.type >> 3
                            ));
    }
    ::std::__cxx11::string::append((char *)&local_218);
    ::std::operator+(&local_1d0,"(",&local_258);
    plVar7 = (long *)::std::__cxx11::string::_M_append
                               ((char *)&local_1d0,(ulong)local_278._M_dataplus._M_p);
    __return_storage_ptr__ = local_1d8;
    puVar11 = (ulong *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar11) {
      local_1f8.field_2._M_allocated_capacity = *puVar11;
      local_1f8.field_2._8_8_ = plVar7[3];
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    }
    else {
      local_1f8.field_2._M_allocated_capacity = *puVar11;
      local_1f8._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_1f8._M_string_length = plVar7[1];
    *plVar7 = (long)puVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)::std::__cxx11::string::_M_append
                               ((char *)&local_1f8,(ulong)local_218._M_dataplus._M_p);
    puVar11 = (ulong *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar11) {
      local_238.field_2._M_allocated_capacity = *puVar11;
      local_238.field_2._8_8_ = plVar7[3];
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    }
    else {
      local_238.field_2._M_allocated_capacity = *puVar11;
      local_238._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_238._M_string_length = plVar7[1];
    *plVar7 = (long)puVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)::std::__cxx11::string::append((char *)&local_238);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar10 = (size_type *)(plVar7 + 2);
    if ((size_type *)*plVar7 == psVar10) {
      lVar2 = plVar7[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar7;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
    }
    __return_storage_ptr__->_M_string_length = plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    paVar9 = &local_278.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    _Var14._M_p = local_278._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p);
      _Var14._M_p = local_278._M_dataplus._M_p;
    }
LAB_006b96ac:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var14._M_p == paVar9) goto LAB_006b8e0e;
    goto LAB_006b8e09;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar10 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar10) {
    lVar2 = plVar7[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar7;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
  }
  __return_storage_ptr__->_M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  paVar9 = &local_258.field_2;
LAB_006b8e00:
  _Var14._M_p = (pointer)(&paVar9->_M_allocated_capacity)[-2];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var14._M_p != paVar9) {
LAB_006b8e09:
    operator_delete(_Var14._M_p);
  }
LAB_006b8e0e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

static string ToString(const T &entry) {
		auto op = ExpressionTypeToOperator(entry.GetExpressionType());
		if (!op.empty()) {
			// use the operator string to represent the operator
			D_ASSERT(entry.children.size() == 2);
			return entry.children[0]->ToString() + " " + op + " " + entry.children[1]->ToString();
		}
		switch (entry.GetExpressionType()) {
		case ExpressionType::COMPARE_IN:
		case ExpressionType::COMPARE_NOT_IN: {
			string op_type = entry.GetExpressionType() == ExpressionType::COMPARE_IN ? " IN " : " NOT IN ";
			string in_child = entry.children[0]->ToString();
			string child_list = "(";
			for (idx_t i = 1; i < entry.children.size(); i++) {
				if (i > 1) {
					child_list += ", ";
				}
				child_list += entry.children[i]->ToString();
			}
			child_list += ")";
			return "(" + in_child + op_type + child_list + ")";
		}
		case ExpressionType::OPERATOR_UNPACK: {
			return StringUtil::Format("UNPACK(%s)", entry.children[0]->ToString());
		}
		case ExpressionType::OPERATOR_TRY: {
			return StringUtil::Format("TRY(%s)", entry.children[0]->ToString());
		}
		case ExpressionType::OPERATOR_NOT: {
			string result = "(";
			result += ExpressionTypeToString(entry.GetExpressionType());
			result += " ";
			result += StringUtil::Join(entry.children, entry.children.size(), ", ",
			                           [](const unique_ptr<BASE> &child) { return child->ToString(); });
			result += ")";
			return result;
		}
		case ExpressionType::GROUPING_FUNCTION:
		case ExpressionType::OPERATOR_COALESCE: {
			string result = ExpressionTypeToString(entry.GetExpressionType());
			result += "(";
			result += StringUtil::Join(entry.children, entry.children.size(), ", ",
			                           [](const unique_ptr<BASE> &child) { return child->ToString(); });
			result += ")";
			return result;
		}
		case ExpressionType::OPERATOR_IS_NULL:
			return "(" + entry.children[0]->ToString() + " IS NULL)";
		case ExpressionType::OPERATOR_IS_NOT_NULL:
			return "(" + entry.children[0]->ToString() + " IS NOT NULL)";
		case ExpressionType::ARRAY_EXTRACT:
			return entry.children[0]->ToString() + "[" + entry.children[1]->ToString() + "]";
		case ExpressionType::ARRAY_SLICE: {
			string begin = entry.children[1]->ToString();
			if (begin == "[]") {
				begin = "";
			}
			string end = entry.children[2]->ToString();
			if (end == "[]") {
				if (entry.children.size() == 4) {
					end = "-";
				} else {
					end = "";
				}
			}
			if (entry.children.size() == 4) {
				return entry.children[0]->ToString() + "[" + begin + ":" + end + ":" + entry.children[3]->ToString() +
				       "]";
			}
			return entry.children[0]->ToString() + "[" + begin + ":" + end + "]";
		}
		case ExpressionType::STRUCT_EXTRACT: {
			if (entry.children[1]->GetExpressionType() != ExpressionType::VALUE_CONSTANT) {
				return string();
			}
			auto child_string = entry.children[1]->ToString();
			D_ASSERT(child_string.size() >= 3);
			D_ASSERT(child_string[0] == '\'' && child_string[child_string.size() - 1] == '\'');
			return StringUtil::Format("(%s).%s", entry.children[0]->ToString(),
			                          SQLIdentifier(child_string.substr(1, child_string.size() - 2)));
		}
		case ExpressionType::ARRAY_CONSTRUCTOR: {
			string result = "(ARRAY[";
			result += StringUtil::Join(entry.children, entry.children.size(), ", ",
			                           [](const unique_ptr<BASE> &child) { return child->ToString(); });
			result += "])";
			return result;
		}
		default:
			throw InternalException("Unrecognized operator type");
		}
	}